

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall ProcessorGenerator::generate_class_definition(ProcessorGenerator *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  char *pcVar6;
  size_type *psVar7;
  t_cpp_generator *ptVar8;
  pointer pptVar9;
  string ret_arg;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string parent_class;
  string local_1a8;
  string local_188;
  vector<t_function_*,_std::allocator<t_function_*>_> local_168;
  string local_150;
  char *local_130;
  char *local_128;
  char local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            (&local_168,&this->service_->functions_);
  local_130 = local_120;
  local_128 = (char *)0x0;
  local_120[0] = '\0';
  if (this->service_->extends_ == (t_service *)0x0) {
    iVar3 = std::__cxx11::string::compare((char *)&this->style_);
    pcVar6 = "::apache::thrift::TDispatchProcessor";
    if (iVar3 == 0) {
      pcVar6 = "::apache::thrift::async::TAsyncDispatchProcessor";
    }
    std::__cxx11::string::_M_replace((ulong)&local_130,0,local_128,(ulong)pcVar6);
    if (this->generator_->gen_templates_ == true) {
      std::__cxx11::string::append((char *)&local_130);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_130);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->f_header_,(this->template_header_)._M_dataplus._M_p,
                      (this->template_header_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"class ",6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->class_name_)._M_dataplus._M_p,
                      (this->class_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : public ",10);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_130,(long)local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," protected:",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar8 = this->generator_;
  piVar1 = &(ptVar8->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"::std::shared_ptr<",0x12);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->if_name_)._M_dataplus._M_p,(this->if_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"> iface_;",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar2 = &local_1a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  poVar4 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"virtual ",8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->ret_type_)._M_dataplus._M_p,(this->ret_type_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"dispatchCall(",0xd);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->finish_cob_)._M_dataplus._M_p,
                      (this->finish_cob_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"::apache::thrift::protocol::TProtocol* iprot, ",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"::apache::thrift::protocol::TProtocol* oprot, ",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"const std::string& fname, int32_t seqid",0x27);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->call_context_)._M_dataplus._M_p,
                      (this->call_context_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") override;",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  ptVar8 = this->generator_;
  if (ptVar8->gen_templates_ == true) {
    poVar4 = this->f_header_;
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"virtual ",8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->ret_type_)._M_dataplus._M_p,(this->ret_type_)._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"dispatchCallTemplated(",0x16);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->finish_cob_)._M_dataplus._M_p,
                        (this->finish_cob_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Protocol_* iprot, Protocol_* oprot, ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"const std::string& fname, int32_t seqid",0x27);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->call_context_)._M_dataplus._M_p,
                        (this->call_context_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    ptVar8 = this->generator_;
  }
  piVar1 = &(ptVar8->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," private:",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar8 = this->generator_;
  piVar1 = &(ptVar8->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"typedef  void (",0xf);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->class_name_)._M_dataplus._M_p,
                      (this->class_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"::*",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ProcessFunction)(",0x11);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->finish_cob_decl_)._M_dataplus._M_p,
                      (this->finish_cob_decl_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"int32_t, ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"::apache::thrift::protocol::TProtocol*, ",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"::apache::thrift::protocol::TProtocol*",0x26);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->call_context_decl_)._M_dataplus._M_p,
                      (this->call_context_decl_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  ptVar8 = this->generator_;
  poVar4 = this->f_header_;
  if (ptVar8->gen_templates_ == true) {
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"typedef void (",0xe);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->class_name_)._M_dataplus._M_p,
                        (this->class_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"::*",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"SpecializedProcessFunction)(",0x1c);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->finish_cob_decl_)._M_dataplus._M_p,
                        (this->finish_cob_decl_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"int32_t, ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Protocol_*, Protocol_*",0x16);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->call_context_decl_)._M_dataplus._M_p,
                        (this->call_context_decl_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this->generator_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_188._M_dataplus._M_p,local_188._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"struct ProcessFunctions {",0x19);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this->generator_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ProcessFunction generic;",0x1a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this->generator_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"  SpecializedProcessFunction specialized;",0x29);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this->generator_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"  ProcessFunctions(ProcessFunction g, ",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"SpecializedProcessFunction s) :",0x1f);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this->generator_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    generic(g),",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this->generator_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    specialized(s) {}",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this->generator_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"  ProcessFunctions() : generic(nullptr), specialized(nullptr) ",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{}",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this->generator_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"};",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this->generator_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_110._M_dataplus._M_p,local_110._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"typedef std::map<std::string, ProcessFunctions> ",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ProcessMap;",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"typedef std::map<std::string, ProcessFunction> ",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ProcessMap;",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  poVar4 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ProcessMap processMap_;",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if (local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar2 = &local_188.field_2;
    pptVar9 = local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      poVar4 = t_generator::indent((t_generator *)this->generator_,this->f_header_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void process_",0xd);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                          ((*pptVar9)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(this->finish_cob_)._M_dataplus._M_p,
                          (this->finish_cob_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 "int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol* oprot"
                 ,0x69);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(this->call_context_)._M_dataplus._M_p,
                          (this->call_context_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (this->generator_->gen_templates_ == true) {
        poVar4 = t_generator::indent((t_generator *)this->generator_,this->f_header_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void process_",0xd);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(this->finish_cob_)._M_dataplus._M_p,
                            (this->finish_cob_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"int32_t seqid, Protocol_* iprot, Protocol_* oprot",0x31);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(this->call_context_)._M_dataplus._M_p,
                            (this->call_context_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      iVar3 = std::__cxx11::string::compare((char *)&this->style_);
      if (iVar3 == 0) {
        iVar3 = (*((*pptVar9)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar3 == '\0') {
          t_cpp_generator::type_name_abi_cxx11_
                    (&local_150,this->generator_,(*pptVar9)->returntype_,false,false);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x37f0a2);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_188.field_2._M_allocated_capacity = *psVar7;
            local_188.field_2._8_8_ = plVar5[3];
            local_188._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar7;
            local_188._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_188._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_1a8.field_2._M_allocated_capacity = *psVar7;
            local_1a8.field_2._8_8_ = plVar5[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar7;
            local_1a8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1a8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
        }
        else {
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
        }
        poVar4 = this->f_header_;
        t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this->generator_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_188._M_dataplus._M_p,local_188._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void return_",0xc);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ",0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"::apache::thrift::protocol::TProtocol* oprot, ",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void* ctx",9);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        ptVar8 = this->generator_;
        if (ptVar8->gen_templates_ == true) {
          poVar4 = this->f_header_;
          t_generator::indent_abi_cxx11_(&local_188,(t_generator *)ptVar8);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_188._M_dataplus._M_p,local_188._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void return_",0xc);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ",0x34);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"Protocol_* oprot, void* ctx",0x1b);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          ptVar8 = this->generator_;
        }
        poVar4 = this->f_header_;
        t_generator::indent_abi_cxx11_(&local_188,(t_generator *)ptVar8);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_188._M_dataplus._M_p,local_188._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void throw_",0xb);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ",0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"::apache::thrift::protocol::TProtocol* oprot, void* ctx, ",0x39);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"::apache::thrift::TDelayedException* _throw);",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        if (this->generator_->gen_templates_ == true) {
          poVar4 = this->f_header_;
          t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this->generator_);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_188._M_dataplus._M_p,local_188._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void throw_",0xb);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"(::std::function<void(bool ok)> cob, int32_t seqid, ",0x34);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"Protocol_* oprot, void* ctx, ",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"::apache::thrift::TDelayedException* _throw);",0x2d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p);
        }
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar4 = this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," public:",8);
  paVar2 = &local_1a8.field_2;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->class_name_)._M_dataplus._M_p,
                      (this->class_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(::std::shared_ptr<",0x13);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->if_name_)._M_dataplus._M_p,(this->if_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"> iface) :",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((this->extends_)._M_string_length != 0) {
    poVar4 = this->f_header_;
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->extends_)._M_dataplus._M_p,(this->extends_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(iface),",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
  }
  poVar4 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  iface_(iface) {",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar9 = local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      poVar4 = this->f_header_;
      t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this->generator_);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"processMap_[\"",0xd);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                          ((*pptVar9)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"] = ",5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      poVar4 = this->f_header_;
      if (this->generator_->gen_templates_ == true) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ProcessFunctions(",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        ptVar8 = this->generator_;
        if (ptVar8->gen_templates_only_ == true) {
          poVar4 = t_generator::indent((t_generator *)ptVar8,this->f_header_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  nullptr,",10);
        }
        else {
          poVar4 = t_generator::indent((t_generator *)ptVar8,this->f_header_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  &",3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,(this->class_name_)._M_dataplus._M_p,
                              (this->class_name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"::process_",10);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar4 = t_generator::indent((t_generator *)this->generator_,this->f_header_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  &",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(this->class_name_)._M_dataplus._M_p,
                            (this->class_name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"::process_",10);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"&",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(this->class_name_)._M_dataplus._M_p,
                            (this->class_name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"::process_",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,((*pptVar9)->name_)._M_dataplus._M_p,((*pptVar9)->name_)._M_string_length)
        ;
      }
      poVar4 = this->f_header_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ptVar8 = this->generator_;
  piVar1 = &(ptVar8->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = this->f_header_;
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)ptVar8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this->generator_);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_188._M_dataplus._M_p,local_188._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"virtual ~",9);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->class_name_)._M_dataplus._M_p,
                      (this->class_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"() {}",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  piVar1 = &(this->generator_->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"};",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (this->generator_->gen_templates_ == true) {
    poVar4 = this->f_header_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"typedef ",8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->class_name_)._M_dataplus._M_p,
                        (this->class_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"< ::apache::thrift::protocol::TDummyProtocol > ",0x2f);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->service_name_)._M_dataplus._M_p,
                        (this->service_name_)._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->pstyle_)._M_dataplus._M_p,(this->pstyle_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Processor;",10);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  if (local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProcessorGenerator::generate_class_definition() {
  // Generate the dispatch methods
  vector<t_function*> functions = service_->get_functions();
  vector<t_function*>::iterator f_iter;

  string parent_class;
  if (service_->get_extends() != nullptr) {
    parent_class = extends_;
  } else {
    if (style_ == "Cob") {
      parent_class = "::apache::thrift::async::TAsyncDispatchProcessor";
    } else {
      parent_class = "::apache::thrift::TDispatchProcessor";
    }

    if (generator_->gen_templates_) {
      parent_class += "T<Protocol_>";
    }
  }

  // Generate the header portion
  f_header_ << template_header_ << "class " << class_name_ << " : public " << parent_class << " {"
            << endl;

  // Protected data members
  f_header_ << " protected:" << endl;
  indent_up();
  f_header_ << indent() << "::std::shared_ptr<" << if_name_ << "> iface_;" << endl;
  f_header_ << indent() << "virtual " << ret_type_ << "dispatchCall(" << finish_cob_
            << "::apache::thrift::protocol::TProtocol* iprot, "
            << "::apache::thrift::protocol::TProtocol* oprot, "
            << "const std::string& fname, int32_t seqid" << call_context_ 
            << ") override;" << endl;
  if (generator_->gen_templates_) {
    f_header_ << indent() << "virtual " << ret_type_ << "dispatchCallTemplated(" << finish_cob_
              << "Protocol_* iprot, Protocol_* oprot, "
              << "const std::string& fname, int32_t seqid" << call_context_ << ");" << endl;
  }
  indent_down();

  // Process function declarations
  f_header_ << " private:" << endl;
  indent_up();

  // Declare processMap_
  f_header_ << indent() << "typedef  void (" << class_name_ << "::*"
            << "ProcessFunction)(" << finish_cob_decl_ << "int32_t, "
            << "::apache::thrift::protocol::TProtocol*, "
            << "::apache::thrift::protocol::TProtocol*" << call_context_decl_ << ");" << endl;
  if (generator_->gen_templates_) {
    f_header_ << indent() << "typedef void (" << class_name_ << "::*"
              << "SpecializedProcessFunction)(" << finish_cob_decl_ << "int32_t, "
              << "Protocol_*, Protocol_*" << call_context_decl_ << ");" << endl << indent()
              << "struct ProcessFunctions {" << endl << indent() << "  ProcessFunction generic;"
              << endl << indent() << "  SpecializedProcessFunction specialized;" << endl << indent()
              << "  ProcessFunctions(ProcessFunction g, "
              << "SpecializedProcessFunction s) :" << endl << indent() << "    generic(g)," << endl
              << indent() << "    specialized(s) {}" << endl << indent()
              << "  ProcessFunctions() : generic(nullptr), specialized(nullptr) "
              << "{}" << endl << indent() << "};" << endl << indent()
              << "typedef std::map<std::string, ProcessFunctions> "
              << "ProcessMap;" << endl;
  } else {
    f_header_ << indent() << "typedef std::map<std::string, ProcessFunction> "
              << "ProcessMap;" << endl;
  }
  f_header_ << indent() << "ProcessMap processMap_;" << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    indent(f_header_) << "void process_" << (*f_iter)->get_name() << "(" << finish_cob_
                      << "int32_t seqid, ::apache::thrift::protocol::TProtocol* iprot, "
                         "::apache::thrift::protocol::TProtocol* oprot" << call_context_ << ");"
                      << endl;
    if (generator_->gen_templates_) {
      indent(f_header_) << "void process_" << (*f_iter)->get_name() << "(" << finish_cob_
                        << "int32_t seqid, Protocol_* iprot, Protocol_* oprot" << call_context_
                        << ");" << endl;
    }
    if (style_ == "Cob") {
      // XXX Factor this out, even if it is a pain.
      string ret_arg = ((*f_iter)->get_returntype()->is_void()
                            ? ""
                            : ", const " + type_name((*f_iter)->get_returntype()) + "& _return");
      f_header_ << indent() << "void return_" << (*f_iter)->get_name()
                << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                << "::apache::thrift::protocol::TProtocol* oprot, "
                << "void* ctx" << ret_arg << ");" << endl;
      if (generator_->gen_templates_) {
        f_header_ << indent() << "void return_" << (*f_iter)->get_name()
                  << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                  << "Protocol_* oprot, void* ctx" << ret_arg << ");" << endl;
      }
      // XXX Don't declare throw if it doesn't exist
      f_header_ << indent() << "void throw_" << (*f_iter)->get_name()
                << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                << "::apache::thrift::protocol::TProtocol* oprot, void* ctx, "
                << "::apache::thrift::TDelayedException* _throw);" << endl;
      if (generator_->gen_templates_) {
        f_header_ << indent() << "void throw_" << (*f_iter)->get_name()
                  << "(::std::function<void(bool ok)> cob, int32_t seqid, "
                  << "Protocol_* oprot, void* ctx, "
                  << "::apache::thrift::TDelayedException* _throw);" << endl;
      }
    }
  }

  f_header_ << " public:" << endl << indent() << class_name_ << "(::std::shared_ptr<" << if_name_
            << "> iface) :" << endl;
  if (!extends_.empty()) {
    f_header_ << indent() << "  " << extends_ << "(iface)," << endl;
  }
  f_header_ << indent() << "  iface_(iface) {" << endl;
  indent_up();

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_header_ << indent() << "processMap_[\"" << (*f_iter)->get_name() << "\"] = ";
    if (generator_->gen_templates_) {
      f_header_ << "ProcessFunctions(" << endl;
      if (generator_->gen_templates_only_) {
        indent(f_header_) << "  nullptr," << endl;
      } else {
        indent(f_header_) << "  &" << class_name_ << "::process_" << (*f_iter)->get_name() << ","
                          << endl;
      }
      indent(f_header_) << "  &" << class_name_ << "::process_" << (*f_iter)->get_name() << ")";
    } else {
      f_header_ << "&" << class_name_ << "::process_" << (*f_iter)->get_name();
    }
    f_header_ << ";" << endl;
  }

  indent_down();
  f_header_ << indent() << "}" << endl << endl << indent() << "virtual ~" << class_name_ << "() {}"
            << endl;
  indent_down();
  f_header_ << "};" << endl << endl;

  if (generator_->gen_templates_) {
    // Generate a backwards compatible typedef, for callers who don't know
    // about the new template-style code.
    //
    // We can't use TProtocol as the template parameter, since ProcessorT
    // provides overloaded versions of most methods, one of which accepts
    // TProtocol pointers, and one which accepts Protocol_ pointers.  This
    // results in a compile error if instantiated with Protocol_ == TProtocol.
    // Therefore, we define TDummyProtocol solely so we can use it as the
    // template parameter here.
    f_header_ << "typedef " << class_name_ << "< ::apache::thrift::protocol::TDummyProtocol > "
              << service_name_ << pstyle_ << "Processor;" << endl << endl;
  }
}